

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void CaDiCaL::fatal_message_start(void)

{
  undefined8 in_RAX;
  Terminal *unaff_retaddr;
  undefined1 bright;
  
  bright = (undefined1)((ulong)in_RAX >> 0x38);
  fflush(_stdout);
  Terminal::bold((Terminal *)0xdd234c);
  fputs("cadical: ",_stderr);
  Terminal::red(unaff_retaddr,(bool)bright);
  fputs("fatal error:",_stderr);
  Terminal::normal((Terminal *)0xdd2395);
  fputc(0x20,_stderr);
  return;
}

Assistant:

void fatal_message_start () {
  fflush (stdout);
  terr.bold ();
  fputs ("cadical: ", stderr);
  terr.red (1);
  fputs ("fatal error:", stderr);
  terr.normal ();
  fputc (' ', stderr);
}